

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::visit(Executor *this,StringLiteralNode *node)

{
  Value *pVVar1;
  _Alloc_hider _Var2;
  Value *in_RAX;
  _Alloc_hider local_18;
  
  local_18._M_p = (pointer)in_RAX;
  std::make_unique<String,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe8);
  _Var2._M_p = local_18._M_p;
  local_18._M_p = (pointer)0x0;
  pVVar1 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
           super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
           super__Head_base<0UL,_Value_*,_false>._M_head_impl;
  (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
  super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.super__Head_base<0UL,_Value_*,_false>
  ._M_head_impl = (Value *)_Var2._M_p;
  if (pVVar1 != (Value *)0x0) {
    (*pVVar1->_vptr_Value[1])();
    if ((long *)local_18._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_18._M_p + 8))();
    }
  }
  return;
}

Assistant:

void Executor::visit(const StringLiteralNode& node)
{
  value_ = std::make_unique<String>(node.getValue());
}